

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

float ImGui::CalcItemWidth(void)

{
  float fVar1;
  ImGuiWindow *pIVar2;
  float *pfVar3;
  ImVec2 IVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  pIVar2 = GImGui->CurrentWindow;
  pfVar3 = &(GImGui->NextItemData).Width;
  if (((GImGui->NextItemData).Flags & 1) == 0) {
    pfVar3 = &(pIVar2->DC).ItemWidth;
  }
  fVar1 = *pfVar3;
  auVar6 = ZEXT416((uint)fVar1);
  if (fVar1 < 0.0) {
    IVar4 = GetContentRegionMaxAbs();
    auVar6 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),
                        ZEXT416((uint)((IVar4.x - (pIVar2->DC).CursorPos.x) + fVar1)));
  }
  auVar5._0_4_ = (int)auVar6._0_4_;
  auVar5._4_4_ = (int)auVar6._4_4_;
  auVar5._8_4_ = (int)auVar6._8_4_;
  auVar5._12_4_ = (int)auVar6._12_4_;
  auVar6 = vcvtdq2ps_avx(auVar5);
  return auVar6._0_4_;
}

Assistant:

float ImGui::CalcItemWidth()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    float w;
    if (g.NextItemData.Flags & ImGuiNextItemDataFlags_HasWidth)
        w = g.NextItemData.Width;
    else
        w = window->DC.ItemWidth;
    if (w < 0.0f)
    {
        float region_max_x = GetContentRegionMaxAbs().x;
        w = ImMax(1.0f, region_max_x - window->DC.CursorPos.x + w);
    }
    w = IM_FLOOR(w);
    return w;
}